

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O3

void Mvc_CoverMakeCubeFree(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  Mvc_Cube_t *pMVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  Mvc_CoverAllocateMask(pCover);
  Mvc_CoverCommonCube(pCover,pCover->pMask);
  for (pMVar2 = (pCover->lCubes).pHead; pMVar2 != (Mvc_Cube_t *)0x0; pMVar2 = pMVar2->pNext) {
    uVar4 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
    if (uVar4 == 0) {
      pMVar2->pData[0] = pMVar2->pData[0] & ~pCover->pMask->pData[0];
    }
    else if (uVar4 == 1) {
      pMVar1 = pCover->pMask;
      pMVar2->pData[0] = pMVar2->pData[0] & ~pMVar1->pData[0];
      *(uint *)&pMVar2->field_0x14 = *(uint *)&pMVar2->field_0x14 & ~*(uint *)&pMVar1->field_0x14;
    }
    else {
      pMVar1 = pCover->pMask;
      uVar3 = (ulong)(*(uint *)&pMVar2->field_0x8 & 0xffffff);
      do {
        pMVar2->pData[uVar3] = pMVar2->pData[uVar3] & ~pMVar1->pData[uVar3];
        bVar5 = uVar3 != 0;
        uVar3 = uVar3 - 1;
      } while (bVar5);
    }
  }
  return;
}

Assistant:

void Mvc_CoverMakeCubeFree( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    // get the common cube
    Mvc_CoverAllocateMask( pCover );
    Mvc_CoverCommonCube( pCover, pCover->pMask );
    // remove this cube from the cubes in the cover
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitSharp( pCube, pCube, pCover->pMask );
}